

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O1

bool __thiscall JsUtil::JobProcessor::RemoveJob(JobProcessor *this,Job *job)

{
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (job == (Job *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x144,"(job)","job");
    if (!bVar3) goto LAB_006847b2;
    *puVar4 = 0;
  }
  bVar3 = DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>::
          Contains<JsUtil::JobManager>(job->manager,(this->managers).head);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x145,"(managers.Contains(job->Manager()))",
                       "managers.Contains(job->Manager())");
    if (!bVar3) goto LAB_006847b2;
    *puVar4 = 0;
  }
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x146,"(!IsClosed())","!IsClosed()");
    if (!bVar3) goto LAB_006847b2;
    *puVar4 = 0;
  }
  DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkPartial<JsUtil::Job>
            (job,&(this->jobs).head,&(this->jobs).tail);
  (job->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).previous = (Type)0x0;
  (job->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).next = (Type)0x0;
  if (job->manager->numJobsAddedToProcessor == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x149,"(job->Manager()->numJobsAddedToProcessor != 0)",
                       "job->Manager()->numJobsAddedToProcessor != 0");
    if (!bVar3) {
LAB_006847b2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar1 = &job->manager->numJobsAddedToProcessor;
  *puVar1 = *puVar1 - 1;
  return true;
}

Assistant:

bool JobProcessor::RemoveJob(Job *const job)
    {
        // This function is called from inside the lock

        Assert(job);
        Assert(managers.Contains(job->Manager()));
        Assert(!IsClosed());

        jobs.Unlink(job);
        Assert(job->Manager()->numJobsAddedToProcessor != 0);
        --job->Manager()->numJobsAddedToProcessor;
        return true;
    }